

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Print_patch(int g_a,int ilo,int ihi,int jlo,int jhi,int pretty)

{
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  int i_1;
  int i;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer p;
  Integer hi [2];
  Integer lo [2];
  Integer a;
  Integer in_stack_ffffffffffffff28;
  int iVar1;
  int iVar2;
  Integer *in_stack_ffffffffffffff38;
  Integer in_stack_ffffffffffffff40;
  long local_88 [7];
  long local_50;
  long local_48 [5];
  long local_20;
  
  local_20 = (long)in_EDI;
  local_50 = (long)in_R9D;
  local_48[2] = (long)in_ESI;
  local_48[0] = (long)in_EDX;
  local_48[3] = (long)in_R8D;
  for (iVar2 = 0; iVar2 < 2; iVar2 = iVar2 + 1) {
    local_88[1 - iVar2] = local_48[(long)iVar2 + 2] + 1;
  }
  for (iVar1 = 0; iVar1 < 2; iVar1 = iVar1 + 1) {
    *(long *)(&stack0xffffffffffffff38 + (long)(1 - iVar1) * 8) = local_48[iVar1] + 1;
  }
  pnga_print_patch(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                   (Integer *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffff28);
  return;
}

Assistant:

void GA_Print_patch(int g_a,int ilo,int ihi,int jlo,int jhi,int pretty)
{
    Integer a = (Integer)g_a;
    Integer lo[2];
    Integer hi[2];
    Integer p = (Integer) pretty;
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];

    lo[0] = ilo; lo[1] = jlo;
    hi[0] = ihi; lo[1] = jhi;
    COPYINDEX_C2F(lo,_ga_lo,2);
    COPYINDEX_C2F(hi,_ga_hi,2);
    wnga_print_patch(a, _ga_lo, _ga_hi, p);
}